

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O0

void CipherFileTest(FileTest *t)

{
  Span<const_unsigned_char> iv_00;
  Span<const_unsigned_char> plaintext_00;
  Span<const_unsigned_char> ciphertext_00;
  Span<const_unsigned_char> aad_00;
  Span<const_unsigned_char> tag_00;
  Operation input_op;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cipher_00;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  string *__lhs;
  Message *pMVar5;
  char *in_R9;
  uchar *local_500;
  size_t sStack_4f8;
  uchar *local_4f0;
  size_t sStack_4e8;
  uchar *local_4e0;
  size_t sStack_4d8;
  uchar *local_4d0;
  size_t sStack_4c8;
  uchar *local_4c0;
  size_t sStack_4b8;
  Span<const_unsigned_char> local_4b0;
  AssertHelper local_4a0;
  Message local_498;
  allocator<char> local_489;
  string local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_468;
  string *str;
  string local_458;
  Operation local_434;
  undefined1 local_430 [4];
  Operation op;
  AssertHelper local_410;
  Message local_408;
  allocator<char> local_3f9;
  string local_3f8;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_3a0;
  Message local_398;
  allocator<char> local_389;
  string local_388;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_330;
  Message local_328;
  allocator<char> local_319;
  string local_318;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2c0;
  Message local_2b8;
  allocator<char> local_2a9;
  string local_2a8;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_250;
  Message local_248;
  allocator<char> local_239;
  string local_238;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1e0;
  Message local_1d8;
  allocator<char> local_1c9;
  string local_1c8;
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tag;
  vector<unsigned_char,_std::allocator<unsigned_char>_> aad;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> plaintext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  EVP_CIPHER *cipher;
  string local_b0;
  AssertHelper local_90;
  Message local_88 [3];
  allocator<char> local_69;
  string local_68;
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  string cipher_str;
  FileTest *t_local;
  
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Cipher",&local_69);
  local_41 = FileTest::GetAttribute(t,(string *)&gtest_ar_.message_,&local_68);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_40,
               (AssertionResult *)"t->GetAttribute(&cipher_str, \"Cipher\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x1aa,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (!bVar1) goto LAB_002d7d88;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )GetCipher((string *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<evp_cipher_st_const*>
            ((AssertionResult *)local_d0,(evp_cipher_st **)&gtest_ar__1.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_d0,
               (AssertionResult *)0x82e709,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x1ac,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string
              ((string *)
               &key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  if (!bVar1) goto LAB_002d7d88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"Key",&local_1c9);
  local_1a1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &iv.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1a0,
               (AssertionResult *)"t->GetBytes(&key, \"Key\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x1af,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Plaintext",&local_239);
    local_211 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &ciphertext.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_238)
    ;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_210,&local_211,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_248);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_210,
                 (AssertionResult *)"t->GetBytes(&plaintext, \"Plaintext\")","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x1b0,pcVar4);
      testing::internal::AssertHelper::operator=(&local_250,&local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_248);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"Ciphertext",&local_2a9);
      local_281 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &aad.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     &local_2a8);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_280,&local_281,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
      if (!bVar1) {
        testing::Message::Message(&local_2b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__5.message_,(internal *)local_280,
                   (AssertionResult *)"t->GetBytes(&ciphertext, \"Ciphertext\")","false","true",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x1b1,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
        testing::internal::AssertHelper::~AssertHelper(&local_2c0);
        std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
        testing::Message::~Message(&local_2b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
      if (bVar1) {
        iVar2 = EVP_CIPHER_iv_length
                          ((EVP_CIPHER *)
                           gtest_ar__1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
        if (iVar2 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"IV",&local_319);
          local_2f1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &plaintext.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         &local_318);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
          std::__cxx11::string::~string((string *)&local_318);
          std::allocator<char>::~allocator(&local_319);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
          if (!bVar1) {
            testing::Message::Message(&local_328);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__6.message_,(internal *)local_2f0,
                       (AssertionResult *)"t->GetBytes(&iv, \"IV\")","false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_330,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x1b3,pcVar4);
            testing::internal::AssertHelper::operator=(&local_330,&local_328);
            testing::internal::AssertHelper::~AssertHelper(&local_330);
            std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
            testing::Message::~Message(&local_328);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
          if (!bVar1) goto LAB_002d7d40;
        }
        uVar3 = EVP_CIPHER_mode((EVP_CIPHER *)
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
        if (uVar3 == 6) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"AAD",&local_389);
          local_361 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &tag.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         &local_388);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_360,&local_361,(type *)0x0);
          std::__cxx11::string::~string((string *)&local_388);
          std::allocator<char>::~allocator(&local_389);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
          if (!bVar1) {
            testing::Message::Message(&local_398);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7.message_,(internal *)local_360,
                       (AssertionResult *)"t->GetBytes(&aad, \"AAD\")","false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x1b6,pcVar4);
            testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
            testing::internal::AssertHelper::~AssertHelper(&local_3a0);
            std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_398);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3f8,"Tag",&local_3f9);
            local_3d1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&gtest_ar__2.message_,&local_3f8);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
            std::__cxx11::string::~string((string *)&local_3f8);
            std::allocator<char>::~allocator(&local_3f9);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
            if (!bVar1) {
              testing::Message::Message(&local_408);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_430,(internal *)local_3d0,
                         (AssertionResult *)"t->GetBytes(&tag, \"Tag\")","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_410,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x1b7,pcVar4);
              testing::internal::AssertHelper::operator=(&local_410,&local_408);
              testing::internal::AssertHelper::~AssertHelper(&local_410);
              std::__cxx11::string::~string((string *)local_430);
              testing::Message::~Message(&local_408);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
            if (bVar1) goto LAB_002d78fc;
          }
        }
        else {
LAB_002d78fc:
          local_434 = kBoth;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_458,"Operation",(allocator<char> *)((long)&str + 7));
          bVar1 = FileTest::HasAttribute(t,&local_458);
          std::__cxx11::string::~string((string *)&local_458);
          std::allocator<char>::~allocator((allocator<char> *)((long)&str + 7));
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_488,"Operation",&local_489);
            __lhs = FileTest::GetAttributeOrDie(t,&local_488);
            std::__cxx11::string::~string((string *)&local_488);
            std::allocator<char>::~allocator(&local_489);
            local_468 = __lhs;
            bVar1 = std::operator==(__lhs,"Encrypt");
            if ((bVar1) || (bVar1 = std::operator==(local_468,"ENCRYPT"), bVar1)) {
              local_434 = kEncrypt;
            }
            else {
              bVar1 = std::operator==(local_468,"Decrypt");
              if ((bVar1) || (bVar1 = std::operator==(local_468,"DECRYPT"), bVar1)) {
                local_434 = kDecrypt;
              }
              else {
                bVar1 = std::operator==(local_468,"InvalidDecrypt");
                if (!bVar1) {
                  testing::Message::Message(&local_498);
                  pMVar5 = testing::Message::operator<<
                                     (&local_498,(char (*) [20])"Unknown operation: ");
                  pMVar5 = testing::Message::operator<<(pMVar5,local_468);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_4a0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                             ,0x1c4,"Failed");
                  testing::internal::AssertHelper::operator=(&local_4a0,pMVar5);
                  testing::internal::AssertHelper::~AssertHelper(&local_4a0);
                  testing::Message::~Message(&local_498);
                  goto LAB_002d7d40;
                }
                local_434 = kInvalidDecrypt;
              }
            }
          }
          cipher_00._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
          input_op = local_434;
          bssl::Span<unsigned_char_const>::
          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char_const> *)&local_4b0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          bssl::Span<unsigned_char_const>::
          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char_const> *)&local_4c0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          bssl::Span<unsigned_char_const>::
          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char_const> *)&local_4d0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          bssl::Span<unsigned_char_const>::
          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char_const> *)&local_4e0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          bssl::Span<unsigned_char_const>::
          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char_const> *)&local_4f0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          bssl::Span<unsigned_char_const>::
          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char_const> *)&local_500,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_)
          ;
          iv_00.size_ = sStack_4b8;
          iv_00.data_ = local_4c0;
          plaintext_00.size_ = sStack_4c8;
          plaintext_00.data_ = local_4d0;
          ciphertext_00.size_ = sStack_4d8;
          ciphertext_00.data_ = local_4e0;
          aad_00.size_ = sStack_4e8;
          aad_00.data_ = local_4f0;
          tag_00.size_ = sStack_4f8;
          tag_00.data_ = local_500;
          TestCipher((EVP_CIPHER *)
                     cipher_00._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,input_op,false,local_4b0,iv_00,plaintext_00,ciphertext_00,aad_00,
                     tag_00);
        }
      }
    }
  }
LAB_002d7d40:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_002d7d88:
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  return;
}

Assistant:

static void CipherFileTest(FileTest *t) {
  std::string cipher_str;
  ASSERT_TRUE(t->GetAttribute(&cipher_str, "Cipher"));
  const EVP_CIPHER *cipher = GetCipher(cipher_str);
  ASSERT_TRUE(cipher);

  std::vector<uint8_t> key, iv, plaintext, ciphertext, aad, tag;
  ASSERT_TRUE(t->GetBytes(&key, "Key"));
  ASSERT_TRUE(t->GetBytes(&plaintext, "Plaintext"));
  ASSERT_TRUE(t->GetBytes(&ciphertext, "Ciphertext"));
  if (EVP_CIPHER_iv_length(cipher) > 0) {
    ASSERT_TRUE(t->GetBytes(&iv, "IV"));
  }
  if (EVP_CIPHER_mode(cipher) == EVP_CIPH_GCM_MODE) {
    ASSERT_TRUE(t->GetBytes(&aad, "AAD"));
    ASSERT_TRUE(t->GetBytes(&tag, "Tag"));
  }

  Operation op = Operation::kBoth;
  if (t->HasAttribute("Operation")) {
    const std::string &str = t->GetAttributeOrDie("Operation");
    if (str == "Encrypt" || str == "ENCRYPT") {
      op = Operation::kEncrypt;
    } else if (str == "Decrypt" || str == "DECRYPT") {
      op = Operation::kDecrypt;
    } else if (str == "InvalidDecrypt") {
      op = Operation::kInvalidDecrypt;
    } else {
      FAIL() << "Unknown operation: " << str;
    }
  }

  TestCipher(cipher, op, /*padding=*/false, key, iv, plaintext, ciphertext, aad,
             tag);
}